

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::MutablePatternModifier::getPrefixLength(MutablePatternModifier *this)

{
  getPrefixLength((MutablePatternModifier *)((long)&this[-1].currentAffix.fUnion + 0x30));
  return;
}

Assistant:

int32_t MutablePatternModifier::getPrefixLength() const {
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);

    // Enter and exit CharSequence Mode to get the length.
    UErrorCode status = U_ZERO_ERROR; // status fails only with an iilegal argument exception
    nonConstThis->prepareAffix(true);
    int result = AffixUtils::unescapedCodePointCount(currentAffix, *this, status);  // prefix length
    return result;
}